

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_stream_capture.hpp
# Opt level: O2

string * __thiscall
iutest::detail::IUStreamCapture::GetStreamString_abi_cxx11_
          (string *__return_storage_ptr__,IUStreamCapture *this)

{
  int iVar1;
  ostream *poVar2;
  undefined1 local_1a0 [400];
  
  iVar1 = (*(this->m_tempfile).super_IFile.super_IOutStream._vptr_IOutStream[5])
                    (this,(this->m_tempfile).m_filename._M_dataplus._M_p,1);
  if ((char)iVar1 == '\0') {
    IUTestLog::IUTestLog
              ((IUTestLog *)local_1a0,LOG_WARNING,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/include/internal/iutest_stream_capture.hpp"
               ,0x45);
    poVar2 = std::operator<<((ostream *)(local_1a0 + 0x18),"temp file open failed: ");
    std::operator<<(poVar2,(string *)&(this->m_tempfile).m_filename);
    IUTestLog::~IUTestLog((IUTestLog *)local_1a0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)local_1a0);
  }
  else {
    IInStream::ReadAll_abi_cxx11_
              (__return_storage_ptr__,&(this->m_tempfile).super_IFile.super_IInStream);
  }
  return __return_storage_ptr__;
}

Assistant:

::std::string GetStreamString()
    {
        if( !m_tempfile.Open(iutest::IFile::OpenRead) )
        {
            IUTEST_LOG_(WARNING) << "temp file open failed: " << m_tempfile.GetFileName();
            return "";
        }
        return m_tempfile.ReadAll();
    }